

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PClass::Derive(PClass *this,PClass *newclass,FName *name)

{
  int iVar1;
  
  newclass->bRuntimeClass = true;
  newclass->ParentClass = this;
  newclass->ConstructNative = this->ConstructNative;
  (newclass->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  Symbols.ParentSymbolTable =
       &(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
        Symbols;
  iVar1 = name->Index;
  (newclass->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index = iVar1;
  FString::Format(&(newclass->super_PNativeStruct).super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.mDescriptiveName,"Class<%s>",
                  FName::NameData.NameArray[iVar1].Text);
  return;
}

Assistant:

void PClass::Derive(PClass *newclass, FName name)
{
	newclass->bRuntimeClass = true;
	newclass->ParentClass = this;
	newclass->ConstructNative = ConstructNative;
	newclass->Symbols.SetParentTable(&this->Symbols);
	newclass->TypeName = name;
	newclass->mDescriptiveName.Format("Class<%s>", name.GetChars());
}